

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_io.c
# Opt level: O0

int ARKStepGetTimestepperStats
              (void *arkode_mem,long *expsteps,long *accsteps,long *step_attempts,long *fe_evals,
              long *fi_evals,long *nlinsetups,long *netfails)

{
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_R8;
  undefined8 *in_R9;
  undefined8 *in_stack_00000008;
  int retval;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeMem *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  void *in_stack_ffffffffffffffb8;
  long local_40;
  int local_4;
  
  local_4 = arkStep_AccessARKODEStepMem
                      (in_stack_ffffffffffffffb8,
                       (char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffa8,(ARKodeARKStepMem *)0x11ff27);
  if (local_4 == 0) {
    *in_RSI = *(undefined8 *)(*(long *)(local_40 + 0x308) + 0x90);
    *in_RDX = *(undefined8 *)(*(long *)(local_40 + 0x308) + 0x88);
    *in_RCX = *(undefined8 *)(local_40 + 0x328);
    *in_R8 = *(undefined8 *)((long)in_stack_ffffffffffffffb8 + 0x188);
    *in_R9 = *(undefined8 *)((long)in_stack_ffffffffffffffb8 + 400);
    *in_stack_00000008 = *(undefined8 *)((long)in_stack_ffffffffffffffb8 + 0x198);
    step_mem->fe = *(ARKRhsFn *)(local_40 + 0x348);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int ARKStepGetTimestepperStats(void* arkode_mem, long int* expsteps,
                               long int* accsteps, long int* step_attempts,
                               long int* fe_evals, long int* fi_evals,
                               long int* nlinsetups, long int* netfails)
{
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  int retval;

  /* access ARKodeMem and ARKodeARKStepMem structures */
  retval = arkStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* set expsteps and accsteps from adaptivity structure */
  *expsteps = ark_mem->hadapt_mem->nst_exp;
  *accsteps = ark_mem->hadapt_mem->nst_acc;

  /* set remaining outputs */
  *step_attempts = ark_mem->nst_attempts;
  *fe_evals      = step_mem->nfe;
  *fi_evals      = step_mem->nfi;
  *nlinsetups    = step_mem->nsetups;
  *netfails      = ark_mem->netf;

  return (ARK_SUCCESS);
}